

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<double>::checkDeviceBufferTypeIsTexture
          (ManagedBuffer<double> *this)

{
  DeviceBufferType *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  string local_28;
  
  if (2 < this->deviceBufferType - Texture1d) {
    deviceBufferTypeName_abi_cxx11_(&local_28,(polyscope *)&this->deviceBufferType,in_RDX);
    std::operator+(&bStack_48,
                   "ManagedBuffer has wrong type for this operation. Expected a Texture1d/2d/3d but is "
                   ,&local_28);
    exception(&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

bool ManagedBuffer<T>::deviceBufferTypeIsTexture() {
  return ((deviceBufferType == DeviceBufferType::Texture1d) || (deviceBufferType == DeviceBufferType::Texture2d) ||
          (deviceBufferType == DeviceBufferType::Texture3d));
}